

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.hpp
# Opt level: O3

void __thiscall LongReadsDatastore::~LongReadsDatastore(LongReadsDatastore *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer plVar2;
  pointer pLVar3;
  pointer pcVar4;
  pointer pRVar5;
  
  if (this->fd != 0) {
    close(this->fd);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&(this->mapper).reads_in_node);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&(this->mapper).read_paths);
  std::
  _Hashtable<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<long,_long>_>,_std::hash<std::pair<long,_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mapper).all_paths_between._M_h);
  plVar2 = (this->mapper).first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->mapper).first_mapping.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  pLVar3 = (this->mapper).mappings.
           super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->mapper).mappings.
                                 super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  pcVar4 = (this->default_name)._M_dataplus._M_p;
  paVar1 = &(this->default_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->filename)._M_dataplus._M_p;
  paVar1 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pRVar5 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pRVar5 != (pointer)0x0) {
    operator_delete(pRVar5,(long)(this->read_to_fileRecord).
                                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar5);
    return;
  }
  return;
}

Assistant:

~LongReadsDatastore(){
        if (fd) {
            close(fd);
        }
    }